

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfCreateBuffers(ErrorsTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  int local_20;
  byte local_19;
  GLuint buffer;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  _buffer = CONCAT44(extraout_var,iVar2);
  local_19 = 1;
  local_20 = 0;
  (**(code **)(_buffer + 0x3b8))(0xffffffff,&local_20);
  bVar1 = ErrorCheckAndLog(this,"glCreateBuffers",0x501," if n is negative.");
  local_19 = (local_19 & 1 & bVar1) != 0;
  if (local_20 != 0) {
    (**(code **)(_buffer + 0x438))(1,&local_20);
    do {
      iVar2 = (**(code **)(_buffer + 0x800))();
    } while (iVar2 != 0);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool ErrorsTest::TestErrorsOfCreateBuffers()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok = true;

	/* Test. */
	glw::GLuint buffer = 0;

	gl.createBuffers(-1, &buffer);

	is_ok &= ErrorCheckAndLog("glCreateBuffers", GL_INVALID_VALUE, " if n is negative.");

	/* Sanity check. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		/* Possible error cleanup. */
		while (gl.getError())
			;
	}

	return is_ok;
}